

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::GetItemReference
               (Var instance,RecyclableObject *propertyObject,uint32 index,Var *value,
               ScriptContext *requestContext)

{
  int iVar1;
  BOOL BVar2;
  RecyclableObject *pRVar3;
  
  while (((propertyObject->type).ptr)->typeId != TypeIds_Null) {
    iVar1 = (*(propertyObject->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x27])
                      (propertyObject,instance,(ulong)index,value,requestContext);
    if (iVar1 != 0) {
      return (uint)(iVar1 == 1);
    }
    BVar2 = RecyclableObject::SkipsPrototype(propertyObject);
    if (BVar2 != 0) break;
    propertyObject = GetPrototypeNoTrap(propertyObject);
  }
  pRVar3 = ScriptContext::GetMissingItemResult(requestContext);
  *value = pRVar3;
  return 0;
}

Assistant:

BOOL JavascriptOperators::GetItemReference(Var instance, RecyclableObject* propertyObject, uint32 index, Var* value, ScriptContext* requestContext)
    {
        RecyclableObject* object = propertyObject;
        while (!JavascriptOperators::IsNull(object))
        {
            PropertyQueryFlags result;
            if ((result = object->GetItemReferenceQuery(instance, index, value, requestContext)) != PropertyQueryFlags::Property_NotFound)
            {
                return JavascriptConversion::PropertyQueryFlagsToBoolean(result);
            }
            if (object->SkipsPrototype())
            {
                break;
            }
            object = JavascriptOperators::GetPrototypeNoTrap(object);
        }
        *value = requestContext->GetMissingItemResult();
        return false;
    }